

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::BinaryQuadraticModel
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
           *this,Linear<std::__cxx11::basic_string<char>,_double> *linear,
          Quadratic<std::__cxx11::basic_string<char>,_double> *quadratic,double *offset,
          Vartype vartype)

{
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->_idx_to_label).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->_label_to_idx)._M_h._M_buckets = &(this->_label_to_idx)._M_h._M_single_bucket;
  (this->_label_to_idx)._M_h._M_bucket_count = 1;
  (this->_label_to_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_label_to_idx)._M_h._M_element_count = 0;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_label_to_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_label_to_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_offset = *offset;
  this->m_vartype = vartype;
  _initialize_quadmat<cimod::Dense>(this,linear,quadratic,(dispatch_t<cimod::Dense,_Dense>)0x0);
  return;
}

Assistant:

BinaryQuadraticModel(
        const Linear<IndexType, FloatType> &linear,
        const Quadratic<IndexType, FloatType> &quadratic,
        const FloatType &offset,
        const Vartype vartype ) :
        m_offset( offset ),
        m_vartype( vartype ) {
      _initialize_quadmat( linear, quadratic );
    }